

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O1

void leftRotateBMP(TRIPLERGB **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,char *filename,
                  int rotate)

{
  TRIPLERGB *pTVar1;
  undefined1 auVar2 [16];
  BITMAPINFOHEADER bmInfo_00;
  uint uVar3;
  TRIPLERGB **matrix;
  TRIPLERGB *pTVar4;
  TRIPLERGB **ppTVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string command;
  uint local_b4;
  char *local_70 [2];
  char local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  uVar3 = bmInfo.biHeight;
  if (rotate % 0xb4 != 0) {
    bmInfo.biHeight = bmInfo.biWidth;
  }
  local_b4 = bmInfo.biWidth;
  if (rotate % 0xb4 != 0) {
    local_b4 = uVar3;
  }
  uVar7 = (long)(int)bmInfo.biHeight * 8;
  if ((int)bmInfo.biHeight < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  matrix = (TRIPLERGB **)operator_new__(uVar7);
  if (0 < (int)bmInfo.biHeight) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)local_b4;
    uVar7 = SUB168(auVar2 * ZEXT816(3),0);
    if (SUB168(auVar2 * ZEXT816(3),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    uVar10 = 0;
    do {
      pTVar4 = (TRIPLERGB *)operator_new__(uVar7);
      matrix[uVar10] = pTVar4;
      if (0 < (int)local_b4) {
        lVar9 = 0;
        ppTVar5 = mrx;
        uVar6 = uVar3;
        uVar8 = bmInfo.biWidth;
        do {
          uVar8 = uVar8 - 1;
          uVar6 = uVar6 - 1;
          if (rotate == 0x10e) {
            pTVar4 = mrx[(int)uVar6] + uVar10;
LAB_0010c886:
            pTVar1 = matrix[uVar10];
            (&pTVar1->red)[lVar9] = pTVar4->red;
            *(undefined2 *)(&pTVar1->blue + lVar9) = *(undefined2 *)pTVar4;
          }
          else {
            if (rotate == 0xb4) {
              pTVar4 = mrx[(int)(uVar3 + ~(uint)uVar10)] + (int)uVar8;
              goto LAB_0010c886;
            }
            if (rotate == 0x5a) {
              pTVar4 = *ppTVar5 + (int)(~(uint)uVar10 + bmInfo.biWidth);
              goto LAB_0010c886;
            }
          }
          lVar9 = lVar9 + 3;
          ppTVar5 = ppTVar5 + 1;
        } while ((ulong)local_b4 * 3 != lVar9);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != bmInfo.biHeight);
  }
  bmInfo_00.biWidth = local_b4;
  bmInfo_00.biSize = bmInfo.biSize;
  bmInfo_00.biPlanes = bmInfo.biPlanes;
  bmInfo_00.biBitCount = bmInfo.biBitCount;
  bmInfo_00.biHeight = bmInfo.biHeight;
  bmInfo_00.biCompression = bmInfo.biCompression;
  bmInfo_00.biSizeImage = bmInfo.biSizeImage;
  bmInfo_00.biXPelsPerMeter = bmInfo.biXPelsPerMeter;
  bmInfo_00.biYPelsPerMeter = bmInfo.biYPelsPerMeter;
  bmInfo_00.biClrUsed = bmInfo.biClrUsed;
  bmInfo_00.biClrImportant = bmInfo.biClrImportant;
  saveBMPFile(bmFile,bmInfo_00,matrix,filename);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"display ","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_50,local_50 + local_48);
  std::__cxx11::string::append((char *)local_70);
  system(local_70[0]);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void leftRotateBMP(TRIPLERGB **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo,
                   const char *filename, int rotate) {
    int height = bmInfo.biHeight;
    int width = bmInfo.biWidth;
    int newHeight = ((rotate % 180) != 0) ? bmInfo.biHeight = width : height;
    int newWidth = ((rotate % 180) != 0) ? bmInfo.biWidth = height : width;

    TRIPLERGB **newMrx = new TRIPLERGB *[newHeight];

    for (int i = 0; i < newHeight; i++) {
        newMrx[i] = new TRIPLERGB[newWidth];
        for (int j = 0; j < newWidth; j++) {
            switch (rotate) {
                case 90:
                    newMrx[i][j] = mrx[j][width - i - 1];
                    break;
                case 180:
                    newMrx[i][j] = mrx[height - i - 1][width - j - 1];
                    break;
                case 270:
                    newMrx[i][j] = mrx[height - j - 1][i];
                    break;
                default:
                    break;
            }
        }
    }
    saveBMPFile(bmFile, bmInfo, newMrx, filename);
    std::string command = "display ";
    system((command + filename).c_str());
}